

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGetAsyncIterator
               (RegSlot resultReg,RegSlot iterableReg,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeLabel noMethodLabel;
  ByteCodeLabel labelID;
  RegSlot iteratorReg_00;
  ByteCodeWriter *pBVar1;
  RegSlot iteratorReg;
  ByteCodeLabel finished;
  ByteCodeLabel noAsyncIterator;
  ByteCodeWriter *writer;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot iterableReg_local;
  RegSlot resultReg_local;
  
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  noMethodLabel = Js::ByteCodeWriter::DefineLabel(pBVar1);
  EmitGetOptionalObjectMethod(resultReg,iterableReg,0x11,noMethodLabel,byteCodeGenerator,funcInfo);
  EmitFunctionCall(resultReg,resultReg,iterableReg,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(resultReg,byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar1);
  Js::ByteCodeWriter::Br(pBVar1,labelID);
  Js::ByteCodeWriter::MarkLabel(pBVar1,noMethodLabel);
  iteratorReg_00 = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetIterator(iteratorReg_00,iterableReg,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::Reg2(pBVar1,NewAsyncFromSyncIterator,iteratorReg_00,iteratorReg_00);
  Js::ByteCodeWriter::Reg2(pBVar1,Ld_A_ReuseLoc,resultReg,iteratorReg_00);
  FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg_00);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID);
  return;
}

Assistant:

void EmitGetAsyncIterator(
    Js::RegSlot resultReg,
    Js::RegSlot iterableReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    auto* writer = byteCodeGenerator->Writer();

    Js::ByteCodeLabel noAsyncIterator = writer->DefineLabel();
    EmitGetOptionalObjectMethod(
        resultReg,
        iterableReg,
        Js::PropertyIds::_symbolAsyncIterator,
        noAsyncIterator,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(resultReg, resultReg, iterableReg, byteCodeGenerator, funcInfo);
    EmitThrowOnNotObject(resultReg, byteCodeGenerator);

    Js::ByteCodeLabel finished = writer->DefineLabel();
    writer->Br(finished);

    // Iterable does not have a Symbol.asyncIterator method: attempt to get a sync
    // iterable and wrap it with an AsyncFromSyncIterator
    writer->MarkLabel(noAsyncIterator);
    Js::RegSlot iteratorReg = funcInfo->AcquireTmpRegister();
    EmitGetIterator(iteratorReg, iterableReg, byteCodeGenerator, funcInfo);
    writer->Reg2(Js::OpCode::NewAsyncFromSyncIterator, iteratorReg, iteratorReg);
    writer->Reg2(Js::OpCode::Ld_A_ReuseLoc, resultReg, iteratorReg);    
    funcInfo->ReleaseTmpRegister(iteratorReg);
    byteCodeGenerator->Writer()->MarkLabel(finished);
}